

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O0

int IOget_array_size_dimen(char *str,FMFieldList fields,int dimen,int *control_field)

{
  int iVar1;
  FMdata_type FVar2;
  long lVar3;
  int *in_RCX;
  int in_EDX;
  long in_RSI;
  char *in_RDI;
  bool bVar4;
  int i;
  int count;
  char field_name [1024];
  long static_size;
  char *end;
  char *left_paren;
  int local_450;
  int local_44c;
  char local_448 [16];
  char *in_stack_fffffffffffffbc8;
  char *local_38;
  char *local_30;
  int *local_28;
  int local_1c;
  long local_18;
  char *local_10;
  int local_4;
  
  *in_RCX = -1;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_30 = strchr(in_RDI,0x5b);
  if (local_30 == (char *)0x0) {
    local_4 = 0;
  }
  else {
    for (; local_1c != 0; local_1c = local_1c + -1) {
      local_30 = strchr(local_30 + 1,0x5b);
      if (local_30 == (char *)0x0) {
        return 0;
      }
    }
    lVar3 = strtol(local_30 + 1,&local_38,0);
    if (local_30 + 1 == local_38) {
      local_44c = 0;
      local_450 = 0;
      while( true ) {
        bVar4 = false;
        if (local_30[(long)local_44c + 1] != ']') {
          bVar4 = local_30[(long)local_44c + 1] != '\0';
        }
        if (!bVar4) break;
        local_448[local_44c] = local_30[(long)local_44c + 1];
        local_44c = local_44c + 1;
      }
      local_448[local_44c] = '\0';
      while (*(long *)(local_18 + (long)local_450 * 0x18) != 0) {
        iVar1 = strcmp(local_448,*(char **)(local_18 + (long)local_450 * 0x18));
        if (iVar1 == 0) {
          FVar2 = FMstr_to_data_type(in_stack_fffffffffffffbc8);
          if (FVar2 == integer_type) {
            *local_28 = local_450;
            return -1;
          }
          fprintf(_stderr,"Variable length control field \"%s\" not of integer type.\n",local_448);
          return 0;
        }
        local_450 = local_450 + 1;
      }
      fprintf(_stderr,"Array dimension \"%s\" in type spec\"%s\" not recognized.\n",local_448,
              local_10);
      fprintf(_stderr,"Dimension must be a field name (for dynamic arrays) or a positive integer.\n"
             );
      fprintf(_stderr,"To use a #define\'d value for the dimension, use the IOArrayDecl() macro.\n")
      ;
      local_4 = -1;
    }
    else if (*local_38 == ']') {
      if (lVar3 < 1) {
        fprintf(_stderr,"Non-positive array dimension %ld in type spec \"%s\"\n",lVar3,local_10);
        fprintf(_stderr,
                "Dimension must be a field name (for dynamic arrays) or a positive integer.\n");
        fprintf(_stderr,
                "To use a #define\'d value for the dimension, use the IOArrayDecl() macro.\n");
        local_4 = -1;
      }
      else {
        local_4 = (int)lVar3;
      }
    }
    else {
      fprintf(_stderr,"Malformed array dimension, unexpected character \'%c\' in type spec \"%s\"\n"
              ,(ulong)(uint)(int)*local_38,local_10);
      fprintf(_stderr,"Dimension must be a field name (for dynamic arrays) or a positive integer.\n"
             );
      fprintf(_stderr,"To use a #define\'d value for the dimension, use the IOArrayDecl() macro.\n")
      ;
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

extern int
IOget_array_size_dimen(const char *str, FMFieldList fields, int dimen, int *control_field)
{
    char *left_paren, *end;
    long static_size;

    *control_field = -1;
    if ((left_paren = strchr(str, '[')) == NULL) {
	return 0;
    }	
    while (dimen != 0) {
	left_paren = strchr(left_paren + 1, '[');
	if (left_paren == NULL) return 0;
	dimen--;
    }
    static_size = strtol(left_paren + 1, &end, 0);
    if (left_paren + 1 == end) {
	/* dynamic element */
	char field_name[1024];
	int count = 0;
	int i = 0;
	while (((left_paren+1)[count] != ']') &&
	       ((left_paren+1)[count] != 0)) {
	    field_name[count] = (left_paren+1)[count];
	    count++;
	}
	field_name[count] = 0;
	while (fields[i].field_name != NULL) {
	    if (strcmp(field_name, fields[i].field_name) == 0) {
		if (FMstr_to_data_type(fields[i].field_type) ==
		    integer_type) {
		    *control_field = i;
		    return -1;
		} else {
		    fprintf(stderr, "Variable length control field \"%s\" not of integer type.\n", field_name);
		    return 0;
		}
	    }
	    i++;
	}
	fprintf(stderr, "Array dimension \"%s\" in type spec\"%s\" not recognized.\n",
		field_name, str);
	fprintf(stderr, "Dimension must be a field name (for dynamic arrays) or a positive integer.\n");
	fprintf(stderr, "To use a #define'd value for the dimension, use the IOArrayDecl() macro.\n");
	return -1;
    }
    if (*end != ']') {
	fprintf(stderr, "Malformed array dimension, unexpected character '%c' in type spec \"%s\"\n",
		*end, str);
	fprintf(stderr, "Dimension must be a field name (for dynamic arrays) or a positive integer.\n");
	fprintf(stderr, "To use a #define'd value for the dimension, use the IOArrayDecl() macro.\n");
	return -1;
    }
    if (static_size <= 0) {
	fprintf(stderr, "Non-positive array dimension %ld in type spec \"%s\"\n",
		static_size, str);
	fprintf(stderr, "Dimension must be a field name (for dynamic arrays) or a positive integer.\n");
	fprintf(stderr, "To use a #define'd value for the dimension, use the IOArrayDecl() macro.\n");
	return -1;
    }
    return static_size;
}